

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O0

bool __thiscall
S2CrossingEdgeQuery::VisitCells(S2CrossingEdgeQuery *this,S2PaddedCell *pcell,R2Rect *edge_bound)

{
  function<bool_(const_S2ShapeIndexCell_&)> *this_00;
  bool bVar1;
  ostream *poVar2;
  S2CellId x;
  S2ShapeIndexCell *__args;
  R2Rect *pRVar3;
  R1Interval *pRVar4;
  double *pdVar5;
  double dVar6;
  bool local_2fa;
  bool local_2f9;
  bool local_2e9;
  R2Rect *local_2c8;
  bool local_289;
  S2PaddedCell local_268;
  S2PaddedCell local_208;
  S2PaddedCell local_1a8;
  S2PaddedCell local_148;
  undefined1 local_e8 [8];
  R2Rect child_bounds [2];
  undefined1 local_a0 [8];
  R2Point center;
  S2CellId local_7c;
  uint64 local_74;
  S2CellId local_6c;
  S2CellId local_64;
  uint64 local_5c;
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  R2Rect *local_28;
  R2Rect *edge_bound_local;
  S2PaddedCell *pcell_local;
  S2CrossingEdgeQuery *this_local;
  
  local_28 = edge_bound;
  edge_bound_local = (R2Rect *)pcell;
  pcell_local = (S2PaddedCell *)this;
  dVar6 = S2PaddedCell::padding(pcell);
  local_41 = 0;
  if (dVar6 != 0.0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc"
               ,0x10c,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar2 = S2LogMessage::stream(&local_40);
    poVar2 = std::operator<<(poVar2,"Check failed: (pcell.padding()) == (0) ");
    S2LogMessageVoidify::operator&(&local_29,poVar2);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  local_64 = S2PaddedCell::id((S2PaddedCell *)edge_bound_local);
  local_5c = (uint64)S2CellId::range_min(&local_64);
  S2ShapeIndex::Iterator::Seek(&this->iter_,(S2CellId)local_5c);
  bVar1 = S2ShapeIndex::Iterator::done(&this->iter_);
  local_289 = true;
  if (!bVar1) {
    local_6c = S2ShapeIndex::Iterator::id(&this->iter_);
    local_7c = S2PaddedCell::id((S2PaddedCell *)edge_bound_local);
    local_74 = (uint64)S2CellId::range_max(&local_7c);
    local_289 = operator>(local_6c,(S2CellId)local_74);
  }
  if (local_289 == false) {
    x = S2ShapeIndex::Iterator::id(&this->iter_);
    register0x00000000 = S2PaddedCell::id((S2PaddedCell *)edge_bound_local);
    bVar1 = ::operator==(x,register0x00000000);
    if (bVar1) {
      this_00 = this->visitor_;
      __args = S2ShapeIndex::Iterator::cell(&this->iter_);
      this_local._7_1_ = std::function<bool_(const_S2ShapeIndexCell_&)>::operator()(this_00,__args);
    }
    else {
      pRVar3 = S2PaddedCell::middle((S2PaddedCell *)edge_bound_local);
      _local_a0 = R2Rect::lo(pRVar3);
      pRVar4 = R2Rect::operator[](local_28,0);
      dVar6 = R1Interval::hi(pRVar4);
      pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                         ((BasicVector<Vector2,_double,_2UL> *)local_a0,0);
      pRVar3 = local_28;
      if (*pdVar5 <= dVar6) {
        pRVar4 = R2Rect::operator[](local_28,0);
        dVar6 = R1Interval::lo(pRVar4);
        pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                           ((BasicVector<Vector2,_double,_2UL> *)local_a0,0);
        pRVar3 = local_28;
        if (dVar6 < *pdVar5) {
          local_2c8 = (R2Rect *)local_e8;
          do {
            R2Rect::R2Rect(local_2c8);
            pRVar3 = local_28;
            local_2c8 = local_2c8 + 1;
          } while (local_2c8 != (R2Rect *)(child_bounds[1].bounds_[1].bounds_.c_ + 1));
          pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                             ((BasicVector<Vector2,_double,_2UL> *)local_a0,0);
          SplitUBound(this,pRVar3,*pdVar5,(R2Rect *)local_e8);
          pRVar4 = R2Rect::operator[](local_28,1);
          dVar6 = R1Interval::hi(pRVar4);
          pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                             ((BasicVector<Vector2,_double,_2UL> *)local_a0,1);
          if (*pdVar5 <= dVar6) {
            pRVar4 = R2Rect::operator[](local_28,1);
            dVar6 = R1Interval::lo(pRVar4);
            pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                               ((BasicVector<Vector2,_double,_2UL> *)local_a0,1);
            if (dVar6 < *pdVar5) {
              pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                                 ((BasicVector<Vector2,_double,_2UL> *)local_a0,1);
              bVar1 = ClipVAxis(this,(R2Rect *)local_e8,*pdVar5,0,(S2PaddedCell *)edge_bound_local);
              local_2fa = false;
              if (bVar1) {
                pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                                   ((BasicVector<Vector2,_double,_2UL> *)local_a0,1);
                local_2fa = ClipVAxis(this,(R2Rect *)(child_bounds[0].bounds_[1].bounds_.c_ + 1),
                                      *pdVar5,1,(S2PaddedCell *)edge_bound_local);
              }
              this_local._7_1_ = local_2fa;
            }
            else {
              S2PaddedCell::S2PaddedCell(&local_208,(S2PaddedCell *)edge_bound_local,0,1);
              bVar1 = VisitCells(this,&local_208,(R2Rect *)local_e8);
              local_2f9 = false;
              if (bVar1) {
                S2PaddedCell::S2PaddedCell(&local_268,(S2PaddedCell *)edge_bound_local,1,1);
                local_2f9 = VisitCells(this,&local_268,
                                       (R2Rect *)(child_bounds[0].bounds_[1].bounds_.c_ + 1));
              }
              this_local._7_1_ = local_2f9;
            }
          }
          else {
            S2PaddedCell::S2PaddedCell(&local_148,(S2PaddedCell *)edge_bound_local,0,0);
            bVar1 = VisitCells(this,&local_148,(R2Rect *)local_e8);
            local_2e9 = false;
            if (bVar1) {
              S2PaddedCell::S2PaddedCell(&local_1a8,(S2PaddedCell *)edge_bound_local,1,0);
              local_2e9 = VisitCells(this,&local_1a8,
                                     (R2Rect *)(child_bounds[0].bounds_[1].bounds_.c_ + 1));
            }
            this_local._7_1_ = local_2e9;
          }
        }
        else {
          pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                             ((BasicVector<Vector2,_double,_2UL> *)local_a0,1);
          this_local._7_1_ = ClipVAxis(this,pRVar3,*pdVar5,1,(S2PaddedCell *)edge_bound_local);
        }
      }
      else {
        pdVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                           ((BasicVector<Vector2,_double,_2UL> *)local_a0,1);
        this_local._7_1_ = ClipVAxis(this,pRVar3,*pdVar5,0,(S2PaddedCell *)edge_bound_local);
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool S2CrossingEdgeQuery::VisitCells(const S2PaddedCell& pcell,
                                     const R2Rect& edge_bound) {
  // This code uses S2PaddedCell because it has the methods we need for
  // efficient splitting, however the actual padding is required to be zero.
  S2_DCHECK_EQ(pcell.padding(), 0);

  iter_.Seek(pcell.id().range_min());
  if (iter_.done() || iter_.id() > pcell.id().range_max()) {
    // The index does not contain "pcell" or any of its descendants.
    return true;
  }
  if (iter_.id() == pcell.id()) {
    return (*visitor_)(iter_.cell());
  }

  // Otherwise, split the edge among the four children of "pcell".
  R2Point center = pcell.middle().lo();
  if (edge_bound[0].hi() < center[0]) {
    // Edge is entirely contained in the two left children.
    return ClipVAxis(edge_bound, center[1], 0, pcell);
  } else if (edge_bound[0].lo() >= center[0]) {
    // Edge is entirely contained in the two right children.
    return ClipVAxis(edge_bound, center[1], 1, pcell);
  } else {
    R2Rect child_bounds[2];
    SplitUBound(edge_bound, center[0], child_bounds);
    if (edge_bound[1].hi() < center[1]) {
      // Edge is entirely contained in the two lower children.
      return (VisitCells(S2PaddedCell(pcell, 0, 0), child_bounds[0]) &&
              VisitCells(S2PaddedCell(pcell, 1, 0), child_bounds[1]));
    } else if (edge_bound[1].lo() >= center[1]) {
      // Edge is entirely contained in the two upper children.
      return (VisitCells(S2PaddedCell(pcell, 0, 1), child_bounds[0]) &&
              VisitCells(S2PaddedCell(pcell, 1, 1), child_bounds[1]));
    } else {
      // The edge bound spans all four children.  The edge itself intersects
      // at most three children (since no padding is being used).
      return (ClipVAxis(child_bounds[0], center[1], 0, pcell) &&
              ClipVAxis(child_bounds[1], center[1], 1, pcell));
    }
  }
}